

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rebuildPage(CellArray *pCArray,int iFirst,int nCell,MemPage *pPg)

{
  ushort uVar1;
  uint uVar2;
  ushort *puVar3;
  char *pcVar4;
  ushort *puVar5;
  int iVar6;
  ushort *__src;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ushort *__dest;
  ulong uVar10;
  ushort *puVar11;
  long lVar12;
  ushort *puVar13;
  long lVar14;
  
  uVar10 = (ulong)pPg->hdrOffset;
  puVar3 = (ushort *)pPg->aData;
  uVar2 = pPg->pBt->usableSize;
  puVar11 = (ushort *)((long)(int)uVar2 + (long)puVar3);
  puVar13 = (ushort *)pPg->aCellIdx;
  uVar1 = *(ushort *)((long)puVar3 + uVar10 + 5);
  uVar7 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
  uVar8 = (ulong)uVar7;
  if (uVar2 < uVar7) {
    uVar8 = 0;
  }
  pcVar4 = pPg->pBt->pPager->pTmpSpace;
  memcpy(pcVar4 + uVar8,(void *)((long)puVar3 + uVar8),(ulong)(uVar2 - (int)uVar8));
  uVar8 = 0;
  do {
    uVar9 = uVar8;
    if (5 < uVar9) break;
    uVar8 = uVar9 + 1;
  } while (pCArray->ixNx[uVar9] <= iFirst);
  lVar14 = (long)iFirst;
  __dest = puVar11;
  do {
    puVar5 = (ushort *)pCArray->apEnd[uVar9];
    do {
      __src = (ushort *)pCArray->apCell[lVar14];
      uVar8 = (ulong)pCArray->szCell[lVar14];
      if ((__src < puVar3) || (puVar11 <= __src)) {
        if ((__src < puVar5) && (puVar5 < (ushort *)((long)__src + uVar8))) {
          iVar6 = 0x111d3;
          goto LAB_0014ba72;
        }
      }
      else {
        if (puVar11 < (ushort *)((long)__src + uVar8)) {
          iVar6 = 0x111ce;
          goto LAB_0014ba72;
        }
        __src = (ushort *)((long)__src + ((long)pcVar4 - (long)puVar3));
      }
      __dest = (ushort *)((long)__dest - uVar8);
      lVar12 = (long)__dest - (long)puVar3;
      *puVar13 = (ushort)lVar12 << 8 | (ushort)lVar12 >> 8;
      puVar13 = puVar13 + 1;
      if (__dest < puVar13) {
        iVar6 = 0x111d9;
LAB_0014ba72:
        iVar6 = sqlite3CorruptError(iVar6);
        return iVar6;
      }
      memcpy(__dest,__src,uVar8);
      lVar14 = lVar14 + 1;
      if (iFirst + nCell <= lVar14) {
        pPg->nCell = (u16)nCell;
        pPg->nOverflow = '\0';
        *(undefined2 *)((long)puVar3 + uVar10 + 1) = 0;
        *(undefined1 *)((long)puVar3 + uVar10 + 3) = *(undefined1 *)((long)&pPg->nCell + 1);
        *(char *)((long)puVar3 + uVar10 + 4) = (char)pPg->nCell;
        *(char *)((long)puVar3 + uVar10 + 5) = (char)((ulong)lVar12 >> 8);
        *(char *)((long)puVar3 + uVar10 + 6) = (char)lVar12;
        *(undefined1 *)((long)puVar3 + uVar10 + 7) = 0;
        return 0;
      }
    } while (lVar14 < pCArray->ixNx[(int)uVar9]);
    uVar9 = (ulong)((int)uVar9 + 1);
  } while( true );
}

Assistant:

static int rebuildPage(
  CellArray *pCArray,             /* Content to be added to page pPg */
  int iFirst,                     /* First cell in pCArray to use */
  int nCell,                      /* Final number of cells on page */
  MemPage *pPg                    /* The page to be reconstructed */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i = iFirst;                 /* Which cell to copy from pCArray*/
  u32 j;                          /* Start of cell content area */
  int iEnd = i+nCell;             /* Loop terminator */
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pSrcEnd;                    /* Current pCArray->apEnd[k] value */

  assert( i<iEnd );
  j = get2byte(&aData[hdr+5]);
  if( NEVER(j>(u32)usableSize) ){ j = 0; }
  memcpy(&pTmp[j], &aData[j], usableSize - j);

  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pSrcEnd = pCArray->apEnd[k];

  pData = pEnd;
  while( 1/*exit by break*/ ){
    u8 *pCell = pCArray->apCell[i];
    u16 sz = pCArray->szCell[i];
    assert( sz>0 );
    if( SQLITE_WITHIN(pCell,aData,pEnd) ){
      if( ((uptr)(pCell+sz))>(uptr)pEnd ) return SQLITE_CORRUPT_BKPT;
      pCell = &pTmp[pCell - aData];
    }else if( (uptr)(pCell+sz)>(uptr)pSrcEnd
           && (uptr)(pCell)<(uptr)pSrcEnd
    ){
      return SQLITE_CORRUPT_BKPT;
    }

    pData -= sz;
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memcpy(pData, pCell, sz);
    assert( sz==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    testcase( sz!=pPg->xCellSize(pPg,pCell) );
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pSrcEnd = pCArray->apEnd[k];
    }
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}